

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall spdlog::details::async_msg::~async_msg(async_msg *this)

{
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x27283f);
  log_msg_buffer::~log_msg_buffer((log_msg_buffer *)0x272849);
  return;
}

Assistant:

~async_msg() = default;